

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handlemgr.cpp
# Opt level: O3

PAL_ERROR __thiscall CorUnix::CSimpleHandleManager::Initialize(CSimpleHandleManager *this)

{
  PAL_ERROR PVar1;
  HANDLE_TABLE_ENTRY *pHVar2;
  long lVar3;
  ulong uVar4;
  
  InternalInitializeCriticalSection(&this->m_csLock);
  this->m_fLockInitialized = true;
  this->m_dwTableSize = 0x400;
  this->m_dwTableGrowthRate = 0x400;
  pHVar2 = (HANDLE_TABLE_ENTRY *)InternalMalloc(0x4000);
  this->m_rghteHandleTable = pHVar2;
  if (pHVar2 == (HANDLE_TABLE_ENTRY *)0x0) {
    PVar1 = 0xe;
  }
  else {
    if (this->m_dwTableSize == 0) {
      uVar4 = 0xffffffff;
    }
    else {
      lVar3 = 0;
      uVar4 = 0;
      do {
        uVar4 = uVar4 + 1;
        *(ulong *)((long)&pHVar2->u + lVar3) = uVar4;
        pHVar2 = this->m_rghteHandleTable;
        (&pHVar2->fEntryAllocated)[lVar3] = false;
        lVar3 = lVar3 + 0x10;
      } while (uVar4 < this->m_dwTableSize);
      uVar4 = (ulong)(this->m_dwTableSize - 1);
    }
    pHVar2[uVar4].u.hiNextIndex = 0xffffffffffffffff;
    this->m_hiFreeListStart = 0;
    this->m_hiFreeListEnd = (ulong)(this->m_dwTableSize - 1);
    PVar1 = 0;
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return PVar1;
  }
  abort();
}

Assistant:

PAL_ERROR
CSimpleHandleManager::Initialize(
    void
    )
{
    PAL_ERROR palError = NO_ERROR;
    
    InternalInitializeCriticalSection(&m_csLock);
    m_fLockInitialized = TRUE;

    m_dwTableGrowthRate = c_BasicGrowthRate;

    /* initialize the handle table - the free list is stored in the 'object'
       field, with the head in the global 'm_hiFreeListStart'. */
    m_dwTableSize = m_dwTableGrowthRate;
    
    m_rghteHandleTable = reinterpret_cast<HANDLE_TABLE_ENTRY*>(InternalMalloc((m_dwTableSize * sizeof(HANDLE_TABLE_ENTRY))));
    if(NULL == m_rghteHandleTable)
    {
        ERROR("Unable to create initial handle table array");
        palError = ERROR_OUTOFMEMORY;
        goto InitializeExit;
    }

    for (DWORD i = 0; i < m_dwTableSize; i++)
    {
        m_rghteHandleTable[i].u.hiNextIndex = i + 1;
        m_rghteHandleTable[i].fEntryAllocated = FALSE;
    }

    m_rghteHandleTable[m_dwTableSize - 1].u.hiNextIndex = (HANDLE_INDEX)-1;
    
    m_hiFreeListStart = 0;
    m_hiFreeListEnd = m_dwTableSize - 1;

    TRACE("Handle Manager initialization complete.\n");

InitializeExit:
    
    return palError;
}